

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanning_tree.cc
# Opt level: O3

void fail_send(socket_t fd,void *buf,int count)

{
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  size_t sVar4;
  vw_exception *this;
  char *__buf;
  stringstream __msg;
  char __errmsg [256];
  string local_2c0;
  stringstream local_2a0 [16];
  ostream local_290 [376];
  char local_118 [256];
  
  sVar1 = send(fd,buf,(long)count,0);
  if (sVar1 != -1) {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_2a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_290,"send: ",6);
  piVar2 = __errno_location();
  __buf = local_118;
  pcVar3 = strerror_r(*piVar2,__buf,0x100);
  if (pcVar3 == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_290,"errno = ",8);
    sVar4 = strlen(__buf);
  }
  else {
    sVar4 = 0xf;
    __buf = "errno = unknown";
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_290,__buf,sVar4);
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/spanning_tree.cc"
             ,0x4f,&local_2c0);
  __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void fail_send(const socket_t fd, const void* buf, const int count)
{
  if (send(fd, (char*)buf, count, 0) == -1)
    THROWERRNO("send: ");
}